

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O2

MacroFormalArgumentListSyntax * __thiscall
slang::parsing::Preprocessor::MacroParser::parseFormalArgumentList(MacroParser *this)

{
  BumpAllocator *this_00;
  _Variadic_union<const_slang::syntax::SyntaxNode_*> _Var1;
  undefined4 extraout_var;
  MacroFormalArgumentListSyntax *pMVar2;
  undefined8 extraout_RDX;
  Token *args;
  Token TVar3;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_128;
  undefined1 local_118;
  Token closeParen;
  Token openParen;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> arguments;
  
  openParen = consume(this);
  Token::Token(&closeParen);
  arguments.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)arguments.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  arguments.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  arguments.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 8;
  while( true ) {
    _Var1 = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)parseFormalArgument(this);
    local_118 = 1;
    local_128._M_rest = _Var1;
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (&arguments.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
               (TokenOrSyntax *)&local_128._M_first);
    TVar3 = peek(this);
    if (TVar3.kind != Comma) break;
    local_128._M_first._M_storage = (_Uninitialized<slang::parsing::Token,_true>)consume(this);
    local_118 = 0;
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (&arguments.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
               (TokenOrSyntax *)&local_128._M_first);
  }
  closeParen = expect(this,CloseParenthesis);
  this_00 = this->pp->alloc;
  local_128._0_4_ =
       SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                 (&arguments.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                  (EVP_PKEY_CTX *)this_00,(EVP_PKEY_CTX *)closeParen.info);
  local_128._M_first._M_storage.rawLen = extraout_var;
  local_128._M_first._M_storage.info = (Info *)extraout_RDX;
  args = &openParen;
  pMVar2 = BumpAllocator::
           emplace<slang::syntax::MacroFormalArgumentListSyntax,slang::parsing::Token&,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token&>
                     (this_00,args,
                      (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)
                      &local_128._M_first,&closeParen);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            (&arguments.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,(EVP_PKEY_CTX *)args);
  return pMVar2;
}

Assistant:

MacroFormalArgumentListSyntax* Preprocessor::MacroParser::parseFormalArgumentList() {
    auto openParen = consume();

    Token closeParen;
    SmallVector<TokenOrSyntax, 8> arguments;
    parseArgumentList(arguments, [this]() { return parseFormalArgument(); }, closeParen);

    return pp.alloc.emplace<MacroFormalArgumentListSyntax>(openParen, arguments.copy(pp.alloc),
                                                           closeParen);
}